

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

void __thiscall HTTPRequest::clean(HTTPRequest *this)

{
  HTTPRequest *this_local;
  
  this->status = WAITING_REQUEST_LINE;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->header);
  if (this->content != (char *)0x0) {
    if (this->content != (char *)0x0) {
      operator_delete(this->content);
    }
    this->content = (char *)0x0;
    this->content_length = 0;
    this->content_received = 0;
  }
  return;
}

Assistant:

void HTTPRequest::clean() {
    this->status = WAITING_REQUEST_LINE;
    this->header.clear();
    if (this->content != nullptr) {
        delete this->content;
        this->content = nullptr;
        this->content_length = 0;
        this->content_received = 0;
    }
}